

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O1

void ctemplate_htmlparser::in_state_cdata(statemachine_ctx *ctx,int start,char chr,int end)

{
  void *pvVar1;
  char local_1;
  
  pvVar1 = ctx->user;
  if (pvVar1 != (void *)0x0) {
    if (*(int *)((long)pvVar1 + 0x24) != 0) {
      jsparser_parse(*(jsparser_ctx **)((long)pvVar1 + 0x10),&local_1,1);
    }
    return;
  }
  __assert_fail("html != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x262,
                "void ctemplate_htmlparser::in_state_cdata(statemachine_ctx *, int, char, int)");
}

Assistant:

static void in_state_cdata(statemachine_ctx *ctx, int start, char chr, int end)
{
  htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
  assert(html != NULL);

  if (html->in_js)
    jsparser_parse_chr(html->jsparser, chr);
}